

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

int stbir__perform_resize(stbir__info *info,int split_start,int split_count)

{
  stbir__per_split_info *split_info;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  stbir__per_split_info *psVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  float *pfVar10;
  float *pfVar11;
  STBIR_VERTICAL_GATHERFUNC **ppSVar12;
  float *pfVar13;
  STBIR_VERTICAL_SCATTERFUNC **ppSVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  stbir__contributors *psVar22;
  stbir__per_split_info *psVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  float fVar29;
  float *local_d8;
  code *local_c8;
  float *local_78 [9];
  
  psVar5 = info->split_info;
  split_info = psVar5 + (uint)split_start;
  psVar22 = (info->vertical).contributors;
  local_d8 = (info->vertical).coefficients;
  iVar1 = psVar5[(uint)split_start].start_output_y;
  iVar2 = split_info[(long)split_count + -1].end_output_y;
  if ((info->vertical).is_gather == 0) {
    iVar24 = split_info->start_input_y;
    lVar28 = (long)(info->vertical).filter_pixel_margin + (long)iVar24;
    if (info->vertical_first == 0) {
      psVar23 = (stbir__per_split_info *)&split_info->vertical_buffer;
      iVar17 = (info->horizontal).scale_info.output_sub_size;
      local_c8 = stbir__encode_first_scanline_from_scatter;
    }
    else {
      iVar17 = ((info->scanline_extents).conservative.n1 - (info->scanline_extents).conservative.n0)
               + 1;
      local_c8 = stbir__horizontal_resample_and_encode_first_scanline_from_scatter;
      psVar23 = split_info;
    }
    iVar15 = split_info[(long)split_count + -1].end_input_y;
    psVar22 = psVar22 + lVar28;
    local_d8 = local_d8 + (long)(int)lVar28 * (long)(info->vertical).coefficient_width;
    pfVar10 = psVar23->decode_buffer;
    iVar3 = info->effective_channels;
    split_info->ring_buffer_first_scanline = iVar1;
    split_info->ring_buffer_last_scanline = -1;
    split_info->ring_buffer_begin_index = -1;
    for (iVar18 = 0; iVar18 < info->ring_buffer_num_entries; iVar18 = iVar18 + 1) {
      pfVar13 = stbir__get_ring_buffer_entry(info,split_info,iVar18);
      *pfVar13 = 3e+38;
    }
    bVar7 = true;
    iVar26 = iVar24;
    for (iVar18 = iVar24; iVar18 < iVar15; iVar18 = iVar18 + 1) {
      iVar9 = psVar22->n0;
      iVar4 = psVar22->n1;
      if (info->ring_buffer_num_entries <= iVar4 - iVar9) {
        __assert_fail("out_last_scanline - out_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                      ,0x191b,
                      "void stbir__vertical_scatter_loop(const stbir__info *, stbir__per_split_info *, int)"
                     );
      }
      if ((iVar9 <= iVar4) &&
         (((iVar1 <= iVar9 && (iVar9 < iVar2)) || ((iVar1 <= iVar4 && (iVar4 < iVar2)))))) {
        if ((bVar7) && (iVar24 < iVar18)) {
          split_info->start_input_y = iVar18;
        }
        iVar26 = iVar1;
        if (iVar9 - iVar1 != 0 && iVar1 <= iVar9) {
          iVar26 = iVar9;
        }
        iVar6 = -(iVar9 - iVar1);
        if (iVar1 <= iVar9) {
          iVar6 = 0;
        }
        if (iVar2 <= iVar4) {
          iVar4 = iVar2 + -1;
        }
        iVar9 = split_info->ring_buffer_begin_index;
        if (iVar9 < 0) {
          iVar9 = iVar26 - iVar1;
          split_info->ring_buffer_begin_index = iVar9;
        }
        if (iVar26 < iVar9) {
          __assert_fail("split_info->ring_buffer_begin_index <= out_first_scanline",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                        ,0x1935,
                        "void stbir__vertical_scatter_loop(const stbir__info *, stbir__per_split_info *, int)"
                       );
        }
        stbir__decode_scanline(info,iVar18,split_info->decode_buffer);
        if (info->vertical_first == 0) {
          stbir__resample_horizontal_gather
                    (info,split_info->vertical_buffer,split_info->decode_buffer);
        }
        if (((split_info->ring_buffer_last_scanline - split_info->ring_buffer_first_scanline) + 1 ==
             info->ring_buffer_num_entries) && (split_info->ring_buffer_last_scanline < iVar4)) {
          (*local_c8)(info,split_info);
        }
        if ((info->vertical).is_gather != 0) {
          __assert_fail("!stbir_info->vertical.is_gather",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                        ,0x18c7,
                        "void stbir__resample_vertical_scatter(const stbir__info *, stbir__per_split_info *, int, int, const float *, const float *, const float *)"
                       );
        }
        if (iVar4 - iVar26 < 0) {
          __assert_fail("total > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                        ,0x18cc,
                        "void stbir__resample_vertical_scatter(const stbir__info *, stbir__per_split_info *, int, int, const float *, const float *, const float *)"
                       );
        }
        uVar8 = (iVar4 - iVar26) + 1;
        iVar9 = 0;
        do {
          uVar19 = 8;
          if ((int)uVar8 < 8) {
            uVar19 = (ulong)uVar8;
          }
          uVar16 = 0;
          if (0 < (int)uVar19) {
            uVar16 = uVar19;
          }
          for (uVar20 = 0; uVar16 != uVar20; uVar20 = uVar20 + 1) {
            iVar27 = (int)uVar20;
            pfVar13 = stbir__get_ring_buffer_scanline(info,split_info,iVar9 + iVar26 + iVar27);
            local_78[uVar20] = pfVar13;
            if ((uVar20 != 0) && (fVar29 = *local_78[0], (*pfVar13 == 3e+38) == (fVar29 != 3e+38)))
            goto LAB_00347ec6;
          }
          fVar29 = *local_78[0];
          iVar27 = (int)uVar19;
LAB_00347ec6:
          ppSVar14 = stbir__vertical_scatter_sets;
          if (fVar29 != 3e+38) {
            ppSVar14 = stbir__vertical_scatter_blends;
          }
          if (NAN(fVar29)) {
            ppSVar14 = stbir__vertical_scatter_blends;
          }
          (*ppSVar14[(long)iVar27 + -1])
                    (local_78,local_d8 + (long)iVar6 + (long)iVar9,pfVar10,
                     pfVar10 + (long)iVar17 * (long)iVar3);
          iVar9 = iVar9 + iVar27;
          uVar8 = uVar8 - iVar27;
        } while (uVar8 != 0);
        bVar7 = false;
        iVar26 = iVar18;
        if (split_info->ring_buffer_last_scanline < iVar4) {
          split_info->ring_buffer_last_scanline = iVar4;
        }
      }
      psVar22 = psVar22 + 1;
      local_d8 = local_d8 + (info->vertical).coefficient_width;
    }
    while (split_info->ring_buffer_first_scanline < iVar2) {
      (*local_c8)(info,split_info);
    }
    uVar16 = 0;
    uVar19 = (ulong)(uint)split_count;
    if (split_count < 1) {
      uVar19 = uVar16;
    }
    for (; uVar19 * 0x78 - uVar16 != 0; uVar16 = uVar16 + 0x78) {
      if (iVar26 + 1 < *(int *)(psVar5[(uint)split_start].no_cache_straddle + (uVar16 - 0x18))) {
        *(int *)(psVar5[(uint)split_start].no_cache_straddle + (uVar16 - 0x18)) = iVar26 + 1;
      }
    }
  }
  else {
    lVar28 = (long)iVar1;
    psVar22 = psVar22 + lVar28;
    iVar1 = (info->vertical).coefficient_width;
    split_info->ring_buffer_begin_index = 0;
    local_d8 = local_d8 + iVar1 * lVar28;
    iVar1 = psVar22->n0;
    split_info->ring_buffer_first_scanline = iVar1;
    uVar8 = iVar1 - 1;
    uVar16 = (ulong)uVar8;
    split_info->ring_buffer_last_scanline = uVar8;
    for (; lVar28 < iVar2; lVar28 = lVar28 + 1) {
      iVar1 = psVar22->n0;
      if (iVar1 < split_info->ring_buffer_first_scanline) {
        __assert_fail("in_first_scanline >= split_info->ring_buffer_first_scanline",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                      ,0x187a,
                      "void stbir__vertical_gather_loop(const stbir__info *, stbir__per_split_info *, int)"
                     );
      }
      iVar24 = psVar22->n1;
      while (iVar17 = split_info->ring_buffer_last_scanline, iVar17 < iVar24) {
        iVar15 = iVar17 - split_info->ring_buffer_first_scanline;
        if (info->ring_buffer_num_entries <= iVar15) {
          __assert_fail("( split_info->ring_buffer_last_scanline - split_info->ring_buffer_first_scanline + 1 ) <= stbir_info->ring_buffer_num_entries"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                        ,0x187f,
                        "void stbir__vertical_gather_loop(const stbir__info *, stbir__per_split_info *, int)"
                       );
        }
        if (iVar15 + 1 == info->ring_buffer_num_entries) {
          split_info->ring_buffer_first_scanline = split_info->ring_buffer_first_scanline + 1;
          split_info->ring_buffer_begin_index = split_info->ring_buffer_begin_index + 1;
        }
        iVar17 = iVar17 + 1;
        if (info->vertical_first == 0) {
          stbir__decode_scanline(info,iVar17,split_info->decode_buffer);
          split_info->ring_buffer_last_scanline = iVar17;
          pfVar10 = stbir__get_ring_buffer_entry
                              (info,split_info,
                               ((iVar17 + split_info->ring_buffer_begin_index) -
                               split_info->ring_buffer_first_scanline) %
                               info->ring_buffer_num_entries);
          stbir__resample_horizontal_gather(info,pfVar10,split_info->decode_buffer);
        }
        else {
          split_info->ring_buffer_last_scanline = iVar17;
          pfVar10 = stbir__get_ring_buffer_scanline(info,split_info,iVar17);
          stbir__decode_scanline(info,split_info->ring_buffer_last_scanline,pfVar10);
        }
      }
      iVar17 = info->vertical_first;
      if (iVar17 == 0) {
        iVar15 = (info->horizontal).scale_info.output_sub_size;
      }
      else {
        iVar15 = ((info->scanline_extents).conservative.n1 -
                 (info->scanline_extents).conservative.n0) + 1;
      }
      if ((info->vertical).is_gather == 0) {
        __assert_fail("stbir_info->vertical.is_gather",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                      ,0x182b,
                      "void stbir__resample_vertical_gather(const stbir__info *, stbir__per_split_info *, int, int, int, const float *)"
                     );
      }
      iVar24 = iVar24 - iVar1;
      if (iVar24 < 0) {
        __assert_fail("total > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                      ,0x1831,
                      "void stbir__resample_vertical_gather(const stbir__info *, stbir__per_split_info *, int, int, int, const float *)"
                     );
      }
      pfVar10 = split_info->decode_buffer;
      pfVar13 = split_info->vertical_buffer;
      iVar3 = info->effective_channels;
      uVar8 = iVar24 + 1;
      pfVar21 = pfVar10;
      if (iVar17 == 0) {
        pfVar21 = pfVar13;
      }
      iVar24 = 0;
      do {
        uVar25 = 8;
        if ((int)uVar8 < 8) {
          uVar25 = uVar8;
        }
        uVar19 = 0;
        if (0 < (int)uVar25) {
          uVar19 = (ulong)uVar25;
        }
        for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
          pfVar11 = stbir__get_ring_buffer_scanline(info,split_info,iVar1 + iVar24 + (int)uVar16);
          local_78[uVar16] = pfVar11;
        }
        ppSVar12 = stbir__vertical_gathers_continues;
        if (iVar24 == 0) {
          ppSVar12 = stbir__vertical_gathers;
        }
        (*ppSVar12[(long)(int)uVar25 + -1])
                  (pfVar21,local_d8 + iVar24,local_78,local_78[0] + (long)iVar15 * (long)iVar3);
        iVar24 = iVar24 + uVar25;
        uVar8 = uVar8 - uVar25;
      } while (uVar8 != 0);
      if (iVar17 != 0) {
        stbir__resample_horizontal_gather(info,pfVar13,pfVar10);
      }
      stbir__encode_scanline
                (info,(void *)(info->output_stride_bytes * lVar28 + (long)info->output_data),pfVar13
                 ,(int)lVar28);
      psVar22 = psVar22 + 1;
      uVar16 = (ulong)(info->vertical).coefficient_width;
      local_d8 = local_d8 + uVar16;
    }
  }
  return (int)uVar16;
}

Assistant:

static int stbir__perform_resize( stbir__info const * info, int split_start, int split_count )
{
  stbir__per_split_info * split_info = info->split_info + split_start;

  STBIR_PROFILE_CLEAR_EXTRAS();

  STBIR_PROFILE_FIRST_START( looping );
  if (info->vertical.is_gather)
    stbir__vertical_gather_loop( info, split_info, split_count );
  else
    stbir__vertical_scatter_loop( info, split_info, split_count );
  STBIR_PROFILE_END( looping );

  return 1;
}